

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dml.cpp
# Opt level: O1

record * __thiscall dml::searchRecord(dml *this,string *typeName,int32_t primaryKey)

{
  pointer pcVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  iterator iVar5;
  ulong uVar6;
  int *piVar7;
  undefined8 *puVar8;
  long *plVar9;
  record *this_00;
  uint uVar10;
  ulong *puVar11;
  ulong uVar12;
  undefined8 uVar13;
  ulong uVar14;
  uint uVar15;
  index iVar16;
  page page;
  string __str;
  fstream searchFile;
  page local_320;
  long local_310;
  undefined8 uStack_308;
  ulong *local_300;
  uint local_2f8;
  undefined4 uStack_2f4;
  ulong local_2f0 [2];
  long *local_2e0;
  undefined8 local_2d8;
  long local_2d0;
  undefined8 uStack_2c8;
  ulong *local_2c0;
  long local_2b8;
  ulong local_2b0;
  long lStack_2a8;
  string local_2a0;
  ulong *local_280;
  long local_278;
  ulong local_270 [2];
  string local_260;
  undefined1 local_240 [528];
  
  iVar5 = SystemCatalog::getType(this->systemCatalog,typeName);
  if ((_Rb_tree_header *)iVar5._M_node ==
      &(this->systemCatalog->types)._M_t._M_impl.super__Rb_tree_header) {
    return (record *)0x0;
  }
  iVar16 = SystemCatalog::searchKey(this->systemCatalog,(type *)(iVar5._M_node + 1),primaryKey);
  uVar6 = iVar16._0_8_;
  piVar7 = __errno_location();
  if (*piVar7 == -1) {
    return (record *)0x0;
  }
  local_280 = local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"data/","");
  pcVar1 = (typeName->_M_dataplus)._M_p;
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_260,pcVar1,pcVar1 + typeName->_M_string_length);
  truncateName(&local_2a0,&local_260);
  uVar14 = 0xf;
  if (local_280 != local_270) {
    uVar14 = local_270[0];
  }
  if (uVar14 < local_2a0._M_string_length + local_278) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      uVar13 = local_2a0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_2a0._M_string_length + local_278) goto LAB_00107d0a;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2a0,0,(char *)0x0,(ulong)local_280);
  }
  else {
LAB_00107d0a:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_2a0._M_dataplus._M_p);
  }
  local_2e0 = &local_2d0;
  plVar9 = puVar8 + 2;
  if ((long *)*puVar8 == plVar9) {
    local_2d0 = *plVar9;
    uStack_2c8 = puVar8[3];
  }
  else {
    local_2d0 = *plVar9;
    local_2e0 = (long *)*puVar8;
  }
  local_2d8 = puVar8[1];
  *puVar8 = plVar9;
  puVar8[1] = 0;
  *(undefined1 *)plVar9 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_2e0);
  puVar11 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar11) {
    local_2b0 = *puVar11;
    lStack_2a8 = plVar9[3];
    local_2c0 = &local_2b0;
  }
  else {
    local_2b0 = *puVar11;
    local_2c0 = (ulong *)*plVar9;
  }
  local_2b8 = plVar9[1];
  *plVar9 = (long)puVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  cVar3 = '\x01';
  if (9 < iVar16.file_id) {
    uVar14 = uVar6;
    cVar2 = '\x04';
    do {
      cVar3 = cVar2;
      uVar10 = (uint)uVar14;
      if (uVar10 < 100) {
        cVar3 = cVar3 + -2;
        goto LAB_00107e26;
      }
      if (uVar10 < 1000) {
        cVar3 = cVar3 + -1;
        goto LAB_00107e26;
      }
      if (uVar10 < 10000) goto LAB_00107e26;
      uVar14 = (uVar14 & 0xffffffff) / 10000;
      cVar2 = cVar3 + '\x04';
    } while (99999 < uVar10);
    cVar3 = cVar3 + '\x01';
  }
LAB_00107e26:
  local_300 = local_2f0;
  std::__cxx11::string::_M_construct((ulong)&local_300,cVar3);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_300,local_2f8,iVar16.file_id);
  uVar14 = CONCAT44(uStack_2f4,local_2f8) + local_2b8;
  uVar12 = 0xf;
  if (local_2c0 != &local_2b0) {
    uVar12 = local_2b0;
  }
  if (uVar12 < uVar14) {
    uVar12 = 0xf;
    if (local_300 != local_2f0) {
      uVar12 = local_2f0[0];
    }
    if (uVar14 <= uVar12) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,(ulong)local_2c0);
      goto LAB_00107ea9;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2c0,(ulong)local_300);
LAB_00107ea9:
  local_320._0_8_ = &local_310;
  plVar9 = puVar8 + 2;
  if ((long *)*puVar8 == plVar9) {
    local_310 = *plVar9;
    uStack_308 = puVar8[3];
  }
  else {
    local_310 = *plVar9;
    local_320._0_8_ = (long *)*puVar8;
  }
  local_320.slots = (uint8_t *)puVar8[1];
  *puVar8 = plVar9;
  puVar8[1] = 0;
  *(undefined1 *)plVar9 = 0;
  std::fstream::fstream(local_240,(string *)&local_320,_S_out|_S_in|_S_bin);
  if ((long *)local_320._0_8_ != &local_310) {
    operator_delete((void *)local_320._0_8_,local_310 + 1);
  }
  if (local_300 != local_2f0) {
    operator_delete(local_300,local_2f0[0] + 1);
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0,local_2b0 + 1);
  }
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0,local_2d0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if (local_280 != local_270) {
    operator_delete(local_280,local_270[0] + 1);
  }
  bVar4 = (char)iVar5._M_node[2]._M_color * '\x04' + 1;
  uVar14 = 0x7fb / (ulong)(bVar4 + 1);
  uVar12 = 0xff;
  if ((uint)uVar14 < 0xff) {
    uVar12 = uVar14;
  }
  ::page::page(&local_320,'\0',(uint)bVar4,(uint8_t)uVar12);
  uVar15 = (uint)(uVar6 >> 0x15) & 0x7f800;
  ::page::read(&local_320,(int)local_240,(void *)(ulong)(uVar15 + 0x16),uVar12);
  this_00 = (record *)operator_new(0x18);
  record::record(this_00,'\0',(char)iVar5._M_node[2]._M_color);
  uVar10 = (local_320.slots[uVar6 >> 0x28 & 0xff] - 1) * local_320.recordSize;
  record::read(this_00,(int)local_240,(void *)(ulong)(uVar10 + local_320.slotSize + uVar15 + 0x18),
               (ulong)uVar10);
  ::page::~page(&local_320);
  std::fstream::~fstream(local_240);
  return this_00;
}

Assistant:

record* dml::searchRecord(string typeName, int32_t primaryKey) {
    auto type = systemCatalog->getType(typeName);

    if(type == systemCatalog->types.end()) { return nullptr; }

    auto index = systemCatalog->searchKey(*type, primaryKey);

    if(errno == -1 ) {
        return nullptr ;
    }

    fstream searchFile(ROOT + truncateName(typeName) + INFIX + to_string(index.file_id), INOUTBIN);

    auto recordSize = (uint8_t) (RECORD_ID + type->numFields * FIELD);

    auto slotSize = (uint8_t) min((PAGE - PAGE_ID - NUM_RECORDS) / (recordSize+ 1), 255);

    page page(0, recordSize, slotSize);

    int offset = (IS_FULL + TYPE_NAME + NUM_PAGES + NUM_RECORDS + LINK_TO_FILE + LINK_TO_FILE) + (index.page_id * PAGE);

    page.read(searchFile, offset);

    auto record = new class record(0, type->numFields);

    record->read(searchFile, offset + (PAGE_ID + PAGE_NUM_RECORDS) + page.slotSize + page.recordSize * (page.slots[index.record_id] - 1));

    return record;
}